

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

char __thiscall
Fl_Preferences::get(Fl_Preferences *this,char *key,void **data,void *defaultValue,int defaultSize)

{
  Node *this_00;
  char cVar1;
  uint uVar2;
  void *pvVar3;
  char *src;
  int dsize;
  int local_24;
  
  this_00 = this->node;
  uVar2 = Node::getEntry(this_00,key);
  if ((int)uVar2 < 0) {
    src = (char *)0x0;
  }
  else {
    src = this_00->entry_[uVar2].value;
  }
  if (src == (char *)0x0) {
    if (defaultValue == (void *)0x0) {
      *data = (void *)0x0;
    }
    else {
      pvVar3 = malloc((long)defaultSize);
      *data = pvVar3;
      memcpy(pvVar3,defaultValue,(long)defaultSize);
    }
    cVar1 = '\0';
  }
  else {
    pvVar3 = decodeHex(src,&local_24);
    *data = pvVar3;
    cVar1 = '\x01';
  }
  return cVar1;
}

Assistant:

char Fl_Preferences::get( const char *key, void *&data, const void *defaultValue, int defaultSize ) {
  const char *v = node->get( key );
  if ( v ) {
    int dsize;
    data = decodeHex( v, dsize );
    return 1;
  }
  if ( defaultValue ) {
    data = (void*)malloc( defaultSize );
    memmove( data, defaultValue, defaultSize );
  }
  else
    data = 0;
  return 0;
}